

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O3

SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax> *
slang::syntax::deepClone<slang::syntax::DefParamAssignmentSyntax>
          (SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax> *node,BumpAllocator *alloc)

{
  size_t sVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar2;
  SyntaxNode *pSVar3;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar4;
  undefined4 extraout_var;
  SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax> *pSVar5;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  undefined8 extraout_RDX_02;
  long lVar6;
  ConstTokenOrSyntax *ele;
  pointer __v;
  DeepCloneVisitor visitor;
  SmallVector<slang::syntax::TokenOrSyntax,_2UL> buffer;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_a0;
  undefined1 local_90;
  Token local_88;
  SmallVector<slang::syntax::TokenOrSyntax,_2UL> local_78;
  
  SmallVector<slang::syntax::TokenOrSyntax,_2UL>::SmallVector
            (&local_78,(node->elements)._M_extent._M_extent_value + 1 >> 1);
  sVar1 = (node->elements)._M_extent._M_extent_value;
  src = extraout_RDX;
  if (sVar1 != 0) {
    __v = (node->elements)._M_ptr;
    lVar6 = sVar1 * 0x18;
    do {
      if (*(__index_type *)
           ((long)&(__v->super_ConstTokenOrSyntax).
                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                   .
                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                   .super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                   .super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
           + 0x10) == '\0') {
        pvVar4 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)__v
                           );
        local_88.kind = pvVar4->kind;
        local_88._2_1_ = pvVar4->field_0x2;
        local_88.numFlags.raw = (pvVar4->numFlags).raw;
        local_88.rawLen = pvVar4->rawLen;
        local_88.info = pvVar4->info;
        local_a0._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)parsing::Token::deepClone(&local_88,alloc)
        ;
        local_90 = 0;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&local_78.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_a0._M_first);
        src = extraout_RDX_01;
      }
      else {
        ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             __v);
        pSVar3 = detail::
                 visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                           (*ppSVar2,(DeepCloneVisitor *)&local_88,alloc);
        local_a0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pSVar3;
        local_90 = 1;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&local_78.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_a0._M_first);
        src = extraout_RDX_00;
      }
      __v = __v + 1;
      lVar6 = lVar6 + -0x18;
    } while (lVar6 != 0);
  }
  local_a0._0_4_ =
       SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                 (&local_78.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                  (EVP_PKEY_CTX *)alloc,src);
  local_a0._M_first._M_storage.rawLen = extraout_var;
  local_a0._M_first._M_storage.info = (Info *)extraout_RDX_02;
  pSVar5 = BumpAllocator::
           emplace<slang::syntax::SeparatedSyntaxList<slang::syntax::DefParamAssignmentSyntax>,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>>
                     (alloc,(span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)
                            &local_a0._M_first);
  if (local_78.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ !=
      (pointer)local_78.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement) {
    operator_delete(local_78.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_);
  }
  return pSVar5;
}

Assistant:

SeparatedSyntaxList<T>* deepClone(const SeparatedSyntaxList<T>& node, BumpAllocator& alloc) {
    SmallVector<TokenOrSyntax> buffer(node.size(), UninitializedTag());
    for (const auto& ele : node.elems()) {
        if (ele.isToken())
            buffer.push_back(ele.token().deepClone(alloc));
        else
            buffer.push_back(static_cast<T*>(deepClone(*ele.node(), alloc)));
    }
    return alloc.emplace<SeparatedSyntaxList<T>>(buffer.copy(alloc));
}